

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGGetParserErrors
              (xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGValidityErrorFunc *err,
              xmlRelaxNGValidityWarningFunc *warn,void **ctx)

{
  if (ctxt != (xmlRelaxNGParserCtxtPtr)0x0) {
    if (err != (xmlRelaxNGValidityErrorFunc *)0x0) {
      *err = ctxt->error;
    }
    if (warn != (xmlRelaxNGValidityWarningFunc *)0x0) {
      *warn = ctxt->warning;
    }
    if (ctx != (void **)0x0) {
      *ctx = ctxt->userData;
    }
    return 0;
  }
  return -1;
}

Assistant:

int
xmlRelaxNGGetParserErrors(xmlRelaxNGParserCtxtPtr ctxt,
                          xmlRelaxNGValidityErrorFunc * err,
                          xmlRelaxNGValidityWarningFunc * warn, void **ctx)
{
    if (ctxt == NULL)
        return (-1);
    if (err != NULL)
        *err = ctxt->error;
    if (warn != NULL)
        *warn = ctxt->warning;
    if (ctx != NULL)
        *ctx = ctxt->userData;
    return (0);
}